

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

bool google::protobuf::compiler::cpp::IsWellKnownMessage(FileDescriptor *file)

{
  int iVar1;
  const_iterator cVar2;
  long lVar3;
  undefined1 local_1ab;
  undefined1 local_1aa;
  undefined1 local_1a9;
  undefined1 *local_1a8 [2];
  undefined1 local_198 [16];
  undefined1 *local_188 [2];
  undefined1 local_178 [16];
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  undefined1 *local_148 [2];
  undefined1 local_138 [16];
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  if (IsWellKnownMessage(google::protobuf::FileDescriptor_const*)::well_known_files_abi_cxx11_ ==
      '\0') {
    iVar1 = __cxa_guard_acquire(&IsWellKnownMessage(google::protobuf::FileDescriptor_const*)::
                                 well_known_files_abi_cxx11_);
    if (iVar1 != 0) {
      local_1a8[0] = local_198;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"google/protobuf/any.proto","");
      local_188[0] = local_178;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_188,"google/protobuf/api.proto","");
      local_168[0] = local_158;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_168,"google/protobuf/compiler/plugin.proto","");
      local_148[0] = local_138;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"google/protobuf/descriptor.proto","");
      local_128[0] = local_118;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_128,"google/protobuf/duration.proto","");
      local_108[0] = local_f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_108,"google/protobuf/empty.proto","");
      local_e8[0] = local_d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e8,"google/protobuf/field_mask.proto","");
      local_c8[0] = local_b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c8,"google/protobuf/source_context.proto","");
      local_a8[0] = local_98;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a8,"google/protobuf/struct.proto","");
      local_88[0] = local_78;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_88,"google/protobuf/timestamp.proto","");
      local_68[0] = local_58;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_68,"google/protobuf/type.proto","");
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,"google/protobuf/wrappers.proto","");
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_Hashtable<std::__cxx11::string_const*>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&IsWellKnownMessage(google::protobuf::FileDescriptor_const*)::
                     well_known_files_abi_cxx11_,local_1a8,&stack0xffffffffffffffd8,0,&local_1a9,
                 &local_1aa,&local_1ab);
      lVar3 = 0;
      do {
        if (local_38 + lVar3 != *(undefined1 **)((long)local_48 + lVar3)) {
          operator_delete(*(undefined1 **)((long)local_48 + lVar3));
        }
        lVar3 = lVar3 + -0x20;
      } while (lVar3 != -0x180);
      __cxa_atexit(std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,
                   &IsWellKnownMessage(google::protobuf::FileDescriptor_const*)::
                    well_known_files_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&IsWellKnownMessage(google::protobuf::FileDescriptor_const*)::
                           well_known_files_abi_cxx11_);
    }
  }
  cVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&IsWellKnownMessage(google::protobuf::FileDescriptor_const*)::
                  well_known_files_abi_cxx11_._M_h,*(key_type **)file);
  return cVar2.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur != (__node_type *)0x0;
}

Assistant:

bool IsWellKnownMessage(const FileDescriptor* file) {
  static const std::unordered_set<std::string> well_known_files{
      "google/protobuf/any.proto",
      "google/protobuf/api.proto",
      "google/protobuf/compiler/plugin.proto",
      "google/protobuf/descriptor.proto",
      "google/protobuf/duration.proto",
      "google/protobuf/empty.proto",
      "google/protobuf/field_mask.proto",
      "google/protobuf/source_context.proto",
      "google/protobuf/struct.proto",
      "google/protobuf/timestamp.proto",
      "google/protobuf/type.proto",
      "google/protobuf/wrappers.proto",
  };
  return well_known_files.find(file->name()) != well_known_files.end();
}